

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

int xmlRelaxNGAddStates(xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGStatesPtr states,
                       xmlRelaxNGValidStatePtr state)

{
  xmlAttrPtr *ppxVar1;
  xmlAttrPtr *ppxVar2;
  xmlRelaxNGValidStatePtr pxVar3;
  int iVar4;
  uint uVar5;
  xmlRelaxNGValidStatePtr *ppxVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  
  iVar4 = -1;
  if (states != (xmlRelaxNGStatesPtr)0x0 && state != (xmlRelaxNGValidStatePtr)0x0) {
    iVar4 = states->maxState;
    if (iVar4 <= states->nbState) {
      ppxVar6 = (xmlRelaxNGValidStatePtr *)(*xmlRealloc)(states->tabState,(long)iVar4 << 4);
      if (ppxVar6 == (xmlRelaxNGValidStatePtr *)0x0) {
        xmlRngVErrMemory(ctxt);
        return -1;
      }
      states->tabState = ppxVar6;
      states->maxState = iVar4 * 2;
    }
    lVar9 = 0;
    while( true ) {
      iVar4 = states->nbState;
      if (iVar4 <= lVar9) break;
      pxVar3 = states->tabState[lVar9];
      if (pxVar3 != (xmlRelaxNGValidStatePtr)0x0) {
        if (pxVar3 == state) {
LAB_00182ea7:
          xmlRelaxNGFreeValidState(ctxt,state);
          return 0;
        }
        if ((((state->node == pxVar3->node) && (state->seq == pxVar3->seq)) &&
            (state->nbAttrLeft == pxVar3->nbAttrLeft)) &&
           ((uVar5 = state->nbAttrs, uVar5 == pxVar3->nbAttrs &&
            (state->endvalue == pxVar3->endvalue)))) {
          if (state->value != pxVar3->value) {
            iVar4 = xmlStrEqual(state->value,pxVar3->value);
            if (iVar4 == 0) goto LAB_00182e52;
            uVar5 = state->nbAttrs;
          }
          uVar7 = (ulong)uVar5;
          if ((int)uVar5 < 1) {
            uVar7 = 0;
          }
          uVar8 = 0;
          do {
            if (uVar7 == uVar8) goto LAB_00182ea7;
            ppxVar1 = state->attrs + uVar8;
            ppxVar2 = pxVar3->attrs + uVar8;
            uVar8 = uVar8 + 1;
          } while (*ppxVar1 == *ppxVar2);
        }
      }
LAB_00182e52:
      lVar9 = lVar9 + 1;
    }
    states->nbState = iVar4 + 1;
    states->tabState[iVar4] = state;
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

static int
xmlRelaxNGAddStates(xmlRelaxNGValidCtxtPtr ctxt,
                    xmlRelaxNGStatesPtr states,
                    xmlRelaxNGValidStatePtr state)
{
    int i;

    if (state == NULL || states == NULL) {
        return (-1);
    }
    if (states->nbState >= states->maxState) {
        xmlRelaxNGValidStatePtr *tmp;
        int size;

        size = states->maxState * 2;
        tmp = (xmlRelaxNGValidStatePtr *) xmlRealloc(states->tabState,
                                                     (size) *
                                                     sizeof
                                                     (xmlRelaxNGValidStatePtr));
        if (tmp == NULL) {
            xmlRngVErrMemory(ctxt);
            return (-1);
        }
        states->tabState = tmp;
        states->maxState = size;
    }
    for (i = 0; i < states->nbState; i++) {
        if (xmlRelaxNGEqualValidState(ctxt, state, states->tabState[i])) {
            xmlRelaxNGFreeValidState(ctxt, state);
            return (0);
        }
    }
    states->tabState[states->nbState++] = state;
    return (1);
}